

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converttif.c
# Opt level: O1

int imagetotif(opj_image_t *image,char *outfile)

{
  OPJ_UINT32 OVar1;
  OPJ_UINT32 OVar2;
  OPJ_UINT32 OVar3;
  opj_image_comp_t *poVar4;
  convert_32s_PXCX p_Var5;
  opj_image_comp_t *poVar6;
  long lVar7;
  ulong uVar8;
  OPJ_BYTE *pOVar9;
  OPJ_INT32 *__ptr;
  code *pcVar10;
  ulong uVar11;
  ulong uVar12;
  undefined4 uVar13;
  OPJ_SIZE_T OVar14;
  OPJ_INT32 OVar15;
  uint uVar16;
  OPJ_SIZE_T OVar17;
  long lVar18;
  OPJ_INT32 *planes [4];
  OPJ_INT32 *local_58;
  long local_50 [4];
  
  poVar4 = image->comps;
  OVar1 = poVar4->prec;
  local_58 = poVar4->data;
  uVar16 = image->numcomps;
  uVar12 = (ulong)uVar16;
  if (image->color_space == OPJ_CLRSPC_CMYK) {
    if (uVar16 < 4) {
      imagetotif_cold_4();
      return 1;
    }
    uVar12 = 4;
    uVar13 = 5;
  }
  else {
    uVar13 = 1;
    if (2 < uVar16) {
      if (3 < uVar16) {
        uVar16 = 4;
      }
      uVar12 = (ulong)uVar16;
      uVar13 = 2;
    }
  }
  uVar16 = (uint)uVar12;
  uVar8 = 1;
  if (1 < uVar16) {
    OVar2 = poVar4->dx;
    uVar11 = 1;
    poVar6 = poVar4;
    do {
      uVar8 = uVar11;
      if ((((OVar2 != poVar6[1].dx) || (poVar4->dy != poVar6[1].dy)) || (OVar1 != poVar6[1].prec))
         || (poVar4->sgnd != poVar6[1].sgnd)) break;
      local_50[uVar11 - 1] = (long)poVar6[1].data;
      uVar11 = uVar11 + 1;
      uVar8 = uVar12;
      poVar6 = poVar6 + 1;
    } while (uVar16 != (uint)uVar11);
  }
  if ((uint)uVar8 == uVar16) {
    if (((int)OVar1 < 0x11) && (OVar1 != 0)) {
      lVar7 = TIFFOpen(outfile);
      if (lVar7 == 0) {
        fprintf(_stderr,"imagetotif:failed to open %s for writing\n",outfile);
      }
      else {
        if (uVar12 != 0) {
          lVar18 = 0;
          do {
            clip_component((opj_image_comp_t *)((long)&image->comps->dx + lVar18),image->comps->prec
                          );
            lVar18 = lVar18 + 0x40;
          } while (uVar12 << 6 != lVar18);
        }
        OVar15 = 0;
        switch(OVar1) {
        case 1:
        case 2:
        case 4:
        case 6:
        case 8:
          pcVar10 = convert_32sXXu_C1R_LUT[(int)OVar1];
          break;
        case 3:
          pcVar10 = tif_32sto3u;
          break;
        case 5:
          pcVar10 = tif_32sto5u;
          break;
        case 7:
          pcVar10 = tif_32sto7u;
          break;
        case 9:
          pcVar10 = tif_32sto9u;
          break;
        case 10:
          pcVar10 = tif_32sto10u;
          break;
        case 0xb:
          pcVar10 = tif_32sto11u;
          break;
        case 0xc:
          pcVar10 = tif_32sto12u;
          break;
        case 0xd:
          pcVar10 = tif_32sto13u;
          break;
        case 0xe:
          pcVar10 = tif_32sto14u;
          break;
        case 0xf:
          pcVar10 = tif_32sto15u;
          break;
        case 0x10:
          pcVar10 = tif_32sto16u;
          break;
        default:
          pcVar10 = (convert_32sXXx_C1R)0x0;
        }
        poVar4 = image->comps;
        if (poVar4->sgnd != 0) {
          OVar15 = 1 << ((char)poVar4->prec - 1U & 0x1f);
        }
        p_Var5 = convert_32s_PXCX_LUT[uVar12];
        OVar2 = poVar4->w;
        OVar3 = poVar4->h;
        TIFFSetField(lVar7,0x100,OVar2);
        TIFFSetField(lVar7,0x101,OVar3);
        TIFFSetField(lVar7,0x115,uVar12);
        TIFFSetField(lVar7,0x102,OVar1);
        TIFFSetField(lVar7,0x112,1);
        TIFFSetField(lVar7,0x11c,1);
        TIFFSetField(lVar7,0x106,uVar13);
        TIFFSetField(lVar7,0x116,1);
        uVar8 = TIFFStripSize(lVar7);
        OVar17 = (OPJ_SIZE_T)(int)OVar2;
        OVar14 = uVar12 * OVar17;
        if ((long)(int)OVar1 * OVar14 + 7 >> 3 == uVar8) {
          pOVar9 = (OPJ_BYTE *)_TIFFmalloc(uVar8);
          if (pOVar9 != (OPJ_BYTE *)0x0) {
            __ptr = (OPJ_INT32 *)malloc(OVar14 * 4);
            if (__ptr != (OPJ_INT32 *)0x0) {
              if (image->comps->h != 0) {
                uVar16 = 0;
                lVar18 = OVar17 * 4;
                do {
                  (*p_Var5)(&local_58,__ptr,OVar17,OVar15);
                  (*pcVar10)(__ptr,pOVar9,OVar14);
                  TIFFWriteEncodedStrip(lVar7,uVar16,pOVar9,uVar8);
                  local_58 = local_58 + OVar17;
                  local_50[0] = local_50[0] + lVar18;
                  local_50[1] = local_50[1] + lVar18;
                  local_50[2] = local_50[2] + lVar18;
                  uVar16 = uVar16 + 1;
                } while (uVar16 < image->comps->h);
              }
              _TIFFfree(pOVar9);
              TIFFClose(lVar7);
              free(__ptr);
              return 0;
            }
            _TIFFfree(pOVar9);
          }
          TIFFClose(lVar7);
        }
        else {
          imagetotif_cold_2();
        }
      }
    }
    else {
      imagetotif_cold_3();
    }
  }
  else {
    imagetotif_cold_1();
  }
  return 1;
}

Assistant:

int imagetotif(opj_image_t * image, const char *outfile)
{
	int width, height;
	int bps,adjust, sgnd;
	int tiPhoto;
	TIFF *tif;
	tdata_t buf;
	tsize_t strip_size;
	OPJ_UINT32 i, numcomps;
	OPJ_SIZE_T rowStride;
	OPJ_INT32* buffer32s = NULL;
	OPJ_INT32 const* planes[4];
	convert_32s_PXCX cvtPxToCx = NULL;
	convert_32sXXx_C1R cvt32sToTif = NULL;

	bps = (int)image->comps[0].prec;
	planes[0] = image->comps[0].data;
	
	numcomps = image->numcomps;
	
	if (image->color_space == OPJ_CLRSPC_CMYK) {
		if (numcomps < 4U) {
			fprintf(stderr,"imagetotif: CMYK images shall be composed of at least 4 planes.\n");
			fprintf(stderr,"\tAborting\n");
			return 1;
		}
		tiPhoto = PHOTOMETRIC_SEPARATED;
		if (numcomps > 4U) {
			numcomps = 4U; /* Alpha not supported */
		}
	}
	else if (numcomps > 2U) {
		tiPhoto = PHOTOMETRIC_RGB;
		if (numcomps > 4U) {
			numcomps = 4U;
		}
	} else {
		tiPhoto = PHOTOMETRIC_MINISBLACK;
	}
	for (i = 1U; i < numcomps; ++i) {
		if (image->comps[0].dx != image->comps[i].dx) {
			break;
		}
		if (image->comps[0].dy != image->comps[i].dy) {
			break;
		}
		if (image->comps[0].prec != image->comps[i].prec) {
			break;
		}
		if (image->comps[0].sgnd != image->comps[i].sgnd) {
			break;
		}
		planes[i] = image->comps[i].data;
	}
	if (i != numcomps) {
		fprintf(stderr,"imagetotif: All components shall have the same subsampling, same bit depth.\n");
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	
	if(bps > 16) bps = 0;
	if(bps == 0)
	{
		fprintf(stderr,"imagetotif: Bits=%d, Only 1 to 16 bits implemented\n",bps);
		fprintf(stderr,"\tAborting\n");
		return 1;
	}
	tif = TIFFOpen(outfile, "wb");
	if (!tif)
	{
		fprintf(stderr, "imagetotif:failed to open %s for writing\n", outfile);
		return 1;
	}
	for (i = 0U; i < numcomps; ++i) {
		clip_component(&(image->comps[i]), image->comps[0].prec);
	}
	cvtPxToCx = convert_32s_PXCX_LUT[numcomps];
	switch (bps) {
		case 1:
		case 2:
		case 4:
		case 6:
		case 8:
			cvt32sToTif = convert_32sXXu_C1R_LUT[bps];
			break;
		case 3:
			cvt32sToTif = tif_32sto3u;
			break;
		case 5:
			cvt32sToTif = tif_32sto5u;
			break;
		case 7:
			cvt32sToTif = tif_32sto7u;
			break;
		case 9:
			cvt32sToTif = tif_32sto9u;
			break;
		case 10:
			cvt32sToTif = tif_32sto10u;
			break;
		case 11:
			cvt32sToTif = tif_32sto11u;
			break;
		case 12:
			cvt32sToTif = tif_32sto12u;
			break;
		case 13:
			cvt32sToTif = tif_32sto13u;
			break;
		case 14:
			cvt32sToTif = tif_32sto14u;
			break;
		case 15:
			cvt32sToTif = tif_32sto15u;
			break;
		case 16:
			cvt32sToTif = (convert_32sXXx_C1R)tif_32sto16u;
			break;
		default:
			/* never here */
			break;
	}
	sgnd = (int)image->comps[0].sgnd;
	adjust = sgnd ? 1 << (image->comps[0].prec - 1) : 0;
	width   = (int)image->comps[0].w;
	height  = (int)image->comps[0].h;
	
	TIFFSetField(tif, TIFFTAG_IMAGEWIDTH, width);
	TIFFSetField(tif, TIFFTAG_IMAGELENGTH, height);
	TIFFSetField(tif, TIFFTAG_SAMPLESPERPIXEL, numcomps);
	TIFFSetField(tif, TIFFTAG_BITSPERSAMPLE, bps);
	TIFFSetField(tif, TIFFTAG_ORIENTATION, ORIENTATION_TOPLEFT);
	TIFFSetField(tif, TIFFTAG_PLANARCONFIG, PLANARCONFIG_CONTIG);
	TIFFSetField(tif, TIFFTAG_PHOTOMETRIC, tiPhoto);
	TIFFSetField(tif, TIFFTAG_ROWSPERSTRIP, 1);
	
	strip_size = TIFFStripSize(tif);
	rowStride = ((OPJ_SIZE_T)width * numcomps * (OPJ_SIZE_T)bps + 7U) / 8U;
	if (rowStride != (OPJ_SIZE_T)strip_size) {
		fprintf(stderr, "Invalid TIFF strip size\n");
		TIFFClose(tif);
		return 1;
	}
	buf = _TIFFmalloc(strip_size);
	if (buf == NULL) {
		TIFFClose(tif);
		return 1;
	}
	buffer32s = (OPJ_INT32 *)malloc((OPJ_SIZE_T)width * numcomps * sizeof(OPJ_INT32));
	if (buffer32s == NULL) {
		_TIFFfree(buf);
		TIFFClose(tif);
		return 1;
	}
	
	for (i = 0; i < image->comps[0].h; ++i) {
		cvtPxToCx(planes, buffer32s, (OPJ_SIZE_T)width, adjust);
		cvt32sToTif(buffer32s, (OPJ_BYTE *)buf, (OPJ_SIZE_T)width * numcomps);
		(void)TIFFWriteEncodedStrip(tif, i, (void*)buf, strip_size);
		planes[0] += width;
		planes[1] += width;
		planes[2] += width;
		planes[3] += width;
	}
	_TIFFfree((void*)buf);
	TIFFClose(tif);
	free(buffer32s);
		
	return 0;
}